

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::AsmJsByteCodeWriter::AsmCall
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCodeAsmJs local_32 [4];
  OpCodeAsmJs op_local;
  
  local_32[0] = op;
  bVar2 = ByteCodeWriter::DoDynamicProfileOpcode(&this->super_ByteCodeWriter,InlinePhase,false);
  if ((bVar2) && (profileId != 0xffff)) {
    bVar2 = OpCodeAttrAsmJs::HasProfiledOp(local_32[0]);
    if (bVar2) {
      OpCodeUtilAsmJs::ConvertOpToProfiled(local_32);
    }
  }
  bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,local_32[0],returnValueRegister,functionRegister,givenArgCount,retType);
  if (!bVar2) {
    bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,local_32[0],returnValueRegister,functionRegister,givenArgCount,retType);
    if (!bVar2) {
      bVar2 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,local_32[0],returnValueRegister,functionRegister,givenArgCount,retType
                        );
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                    ,0x25b,"(success)","success");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  bVar2 = OpCodeAttrAsmJs::IsProfiledOp(local_32[0]);
  if (bVar2) {
    ByteCodeWriter::Data::Encode(&(this->super_ByteCodeWriter).m_byteCodeData,&profileId,2);
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType, Js::ProfileId profileId)
    {
        if (DoDynamicProfileOpcode(InlinePhase) && profileId != Js::Constants::NoProfileId && OpCodeAttrAsmJs::HasProfiledOp(op))
        {
            OpCodeUtilAsmJs::ConvertOpToProfiled(&op);
        }
        MULTISIZE_LAYOUT_WRITE(AsmCall, op, returnValueRegister, functionRegister, givenArgCount, retType);
        if (OpCodeAttrAsmJs::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }